

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::JunitReporter::testRunStarting(JunitReporter *this,TestRunInfo *runInfo)

{
  TestRunInfo *in_RSI;
  CumulativeReporterBase<Catch::JunitReporter> *in_RDI;
  CumulativeReporterBase<Catch::JunitReporter> *name;
  XmlWriter *this_00;
  
  CumulativeReporterBase<Catch::JunitReporter>::testRunStarting(in_RDI,in_RSI);
  name = in_RDI + 1;
  this_00 = (XmlWriter *)&stack0xffffffffffffffcf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffffd0,"testsuites",(allocator *)this_00)
  ;
  operator|(Newline,Indent);
  XmlWriter::startElement(this_00,(string *)name,(XmlFormatting)((ulong)in_RDI >> 0x20));
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcf);
  return;
}

Assistant:

void JunitReporter::testRunStarting( TestRunInfo const& runInfo )  {
        CumulativeReporterBase::testRunStarting( runInfo );
        xml.startElement( "testsuites" );
    }